

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_common.c
# Opt level: O0

void errorlist_destroy(ErrorList *list)

{
  MOJOSHADER_free p_Var1;
  void *pvVar2;
  ErrorItem *pEVar3;
  ErrorItem *next;
  ErrorItem *item;
  void *d;
  MOJOSHADER_free f;
  ErrorList *list_local;
  
  if (list != (ErrorList *)0x0) {
    p_Var1 = list->f;
    pvVar2 = list->d;
    next = (list->head).next;
    while (next != (ErrorItem *)0x0) {
      pEVar3 = next->next;
      (*p_Var1)((next->error).error,pvVar2);
      (*p_Var1)((next->error).filename,pvVar2);
      (*p_Var1)(next,pvVar2);
      next = pEVar3;
    }
    (*p_Var1)(list,pvVar2);
  }
  return;
}

Assistant:

void errorlist_destroy(ErrorList *list)
{
    if (list == NULL)
        return;

    MOJOSHADER_free f = list->f;
    void *d = list->d;
    ErrorItem *item = list->head.next;
    while (item != NULL)
    {
        ErrorItem *next = item->next;
        f((void *) item->error.error, d);
        f((void *) item->error.filename, d);
        f(item, d);
        item = next;
    } // while
    f(list, d);
}